

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::JitAllocator::release(JitAllocator *this,void *rx)

{
  ulong *puVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  Impl *pIVar5;
  long lVar6;
  byte bVar7;
  size_t sVar8;
  long lVar9;
  sbyte sVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long *plVar15;
  uint uVar16;
  pthread_mutex_t *__mutex;
  Error EVar17;
  ulong uVar18;
  JitAllocatorBlock *block;
  ulong uVar19;
  ulong *puVar20;
  ZoneTree<asmjit::v1_14::JitAllocatorBlock> *this_00;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  void *pvVar24;
  uint uVar25;
  JitAllocatorPrivateImpl *impl;
  Compare<(asmjit::v1_14::Support::SortOrder)0> local_79;
  pthread_mutex_t *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  ZoneTree<asmjit::v1_14::JitAllocatorBlock> *local_48;
  size_t local_40;
  ulong local_38;
  
  pIVar5 = this->_impl;
  if (pIVar5 == (Impl *)JitAllocatorImpl_none) {
    EVar17 = 5;
  }
  else if (rx == (void *)0x0) {
    EVar17 = 2;
  }
  else {
    __mutex = (pthread_mutex_t *)(pIVar5 + 1);
    pthread_mutex_lock(__mutex);
    impl = *(JitAllocatorPrivateImpl **)&pIVar5[4].granularity;
    EVar17 = 3;
    if (impl != (JitAllocatorPrivateImpl *)0x0) {
      this_00 = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)&pIVar5[4].granularity;
LAB_0010feb5:
      pvVar24 = *(void **)&impl->field_0x28;
      uVar11 = (uint)(rx < pvVar24) -
               (uint)((void *)(*(long *)&impl->pageSize + (long)pvVar24) <= rx);
      if (uVar11 != 0) goto code_r0x0010fed5;
      lVar9 = *(long *)&impl->field_0x20;
      uVar23 = (ulong)((long)rx - (long)pvVar24) >> (*(byte *)(lVar9 + 0x1e) & 0x3f);
      lVar21 = *(long *)&impl[1].super_Impl;
      uVar11 = (uint)uVar23;
      uVar19 = uVar23 >> 6 & 0x3ffffff;
      puVar20 = (ulong *)(lVar21 + uVar19 * 8);
      sVar10 = (sbyte)(uVar11 & 0x3f);
      uVar23 = (*puVar20 >> sVar10) << sVar10;
      while (uVar23 == 0) {
        puVar1 = puVar20 + 1;
        puVar20 = puVar20 + 1;
        uVar23 = *puVar1;
      }
      lVar6 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      local_38 = lVar6 + ((long)puVar20 - lVar21) * 8;
      uVar12 = (int)local_38 + 1;
      *(long *)(pIVar5 + 4) = *(long *)(pIVar5 + 4) + -1;
      uVar22 = uVar12 - uVar11;
      uVar23 = (ulong)uVar22;
      uVar16 = (uint)impl->allocationCount;
      plVar2 = (long *)(lVar9 + 0x30 + (ulong)(uVar16 & 8));
      *plVar2 = *plVar2 - uVar23;
      uVar25 = *(int *)&impl->tree - uVar22;
      uVar13 = *(uint *)&impl->pools;
      if (uVar11 <= *(uint *)&impl->pools) {
        uVar13 = uVar11;
      }
      uVar3 = *(uint *)((long)&impl->pools + 4);
      if (uVar3 <= uVar12) {
        uVar3 = uVar12;
      }
      *(uint *)&impl->tree = uVar25;
      *(uint *)&impl->pools = uVar13;
      *(uint *)((long)&impl->pools + 4) = uVar3;
      local_78 = __mutex;
      if (uVar12 != uVar11) {
        local_40 = impl->poolCount;
        uVar14 = 0x40 - (ulong)(uVar11 & 0x3f);
        if (uVar23 <= uVar14) {
          uVar14 = uVar23;
        }
        puVar20 = (ulong *)(uVar19 * 8 + 8 + local_40);
        puVar20[-1] = puVar20[-1] & ~((0xffffffffffffffffU >> (-(char)uVar14 & 0x3fU)) << sVar10);
        uVar18 = uVar23 - uVar14;
        if (0x3f < uVar18) {
          uVar14 = (uVar23 - uVar14) - 0x40;
          local_68 = uVar14 >> 6;
          local_70 = uVar19;
          local_60 = uVar23;
          local_58 = lVar21;
          local_50 = lVar9;
          local_48 = this_00;
          memset(puVar20,0,local_68 * 8 + 8);
          uVar22 = (uint)local_60;
          uVar18 = (ulong)((uint)uVar14 & 0x3f);
          puVar20 = (ulong *)(local_40 + local_70 * 8 + local_68 * 8 + 0x10);
          this_00 = local_48;
          lVar9 = local_50;
          lVar21 = local_58;
        }
        if (uVar18 != 0) {
          *puVar20 = *puVar20 & ~(0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU));
        }
      }
      bVar7 = (byte)local_38 & 0x3f;
      puVar20 = (ulong *)(lVar21 + (local_38 >> 6 & 0x3ffffff) * 8);
      *puVar20 = *puVar20 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      if (uVar25 == (uVar16 & 1)) {
        *(uint *)&impl->pools = uVar25;
        iVar4 = *(int *)((long)&impl->allocationCount + 4);
        *(int *)((long)&impl->pools + 4) = iVar4;
        *(uint *)&impl->field_0x4c = iVar4 - uVar25;
        uVar16 = uVar16 & 0xfffffff9 | 2;
      }
      else {
        uVar16 = uVar16 | 4;
      }
      *(uint *)&impl->allocationCount = uVar16;
      if ((pIVar5->options & kFillUnusedMemory) != kNone) {
        pvVar24 = (void *)((ulong)(uVar11 * *(ushort *)(lVar9 + 0x1c)) + *(long *)&impl->field_0x30)
        ;
        uVar23 = (ulong)(*(ushort *)(lVar9 + 0x1c) * uVar22);
        VirtMem::protectJitMemory(kReadWrite);
        JitAllocatorImpl_fillPattern(pvVar24,pIVar5->fillPattern,uVar23);
        VirtMem::protectJitMemory(kReadExecute);
        VirtMem::flushInstructionCache(pvVar24,uVar23);
        uVar16 = (uint)impl->allocationCount;
      }
      EVar17 = 0;
      __mutex = local_78;
      if ((uVar16 & 2) != 0) {
        if ((*(char *)(lVar9 + 0x1f) == '\0') && ((pIVar5->options & kImmediateRelease) == kNone)) {
          *(undefined1 *)(lVar9 + 0x1f) = 1;
        }
        else {
          plVar2 = *(long **)&impl->field_0x20;
          if ((JitAllocatorPrivateImpl *)plVar2[2] == impl) {
            lVar9 = *(long *)&impl->lock;
            if (lVar9 == 0) {
              lVar9 = *(long *)&impl->field_0x18;
            }
            plVar2[2] = lVar9;
          }
          ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
          remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                    (this_00,(ZoneTreeNode *)impl,&local_79);
          lVar9 = *(long *)&impl->lock;
          lVar21 = *(long *)&impl->field_0x18;
          plVar15 = (long *)(lVar9 + 0x18);
          if (lVar9 == 0) {
            plVar15 = plVar2;
          }
          *plVar15 = lVar21;
          block = (JitAllocatorBlock *)(lVar21 + 0x10);
          if (lVar21 == 0) {
            block = (JitAllocatorBlock *)(plVar2 + 1);
          }
          *(long *)block = lVar9;
          *(undefined8 *)&impl->lock = 0;
          *(undefined8 *)&impl->field_0x18 = 0;
          sVar8 = impl->allocationCount;
          *(int *)(plVar2 + 3) = (int)plVar2[3] + -1;
          uVar11 = *(uint *)((long)&impl->allocationCount + 4);
          uVar23 = (ulong)((uint)sVar8 & 8);
          plVar15 = (long *)((long)plVar2 + uVar23 + 0x20);
          *plVar15 = *plVar15 - (ulong)uVar11;
          plVar15 = (long *)((long)plVar2 + uVar23 + 0x30);
          *plVar15 = *plVar15 - (ulong)*(uint *)&impl->tree;
          plVar2[8] = plVar2[8] - (ulong)((uVar11 + 0x3f >> 2 & 0xfffffff0) + 0x68);
          JitAllocatorImpl_deleteBlock(impl,block);
          __mutex = local_78;
        }
      }
    }
LAB_00110195:
    pthread_mutex_unlock(__mutex);
  }
  return EVar17;
code_r0x0010fed5:
  impl = (JitAllocatorPrivateImpl *)
         (*(ulong *)(&(impl->super_Impl).options + (ulong)(uVar11 >> 0x1f) * 2) & 0xfffffffffffffffe
         );
  if (impl == (JitAllocatorPrivateImpl *)0x0) goto LAB_00110195;
  goto LAB_0010feb5;
}

Assistant:

Error JitAllocator::release(void* rx) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rx))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rx));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rx - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->empty()) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}